

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_get(fdb_kvs_handle *handle,fdb_doc *doc)

{
  atomic<unsigned_long> *paVar1;
  fdb_kvs_id_t id;
  size_t __n;
  void *pvVar2;
  docio_handle *handle_00;
  filemgr *file;
  snap_handle *shandle;
  hbtrie *trie;
  btreeblk_handle *handle_01;
  size_t sVar3;
  fdb_status fVar4;
  hbtrie_result hVar5;
  int64_t iVar6;
  long lVar7;
  undefined2 uVar8;
  undefined1 *buf;
  fdb_doc *pfVar9;
  fdb_doc *pfVar10;
  fdb_txn *txn;
  ulong uVar11;
  bool bVar12;
  bool body_alloc;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  fdb_doc doc_kv;
  _fdb_key_cmp_info cmp_info;
  docio_object local_78;
  ulong local_38;
  uint64_t offset;
  
  buf = local_f8;
  local_78.length.keylen = 0;
  local_78.length.metalen = 0;
  local_78.length.bodylen = 0;
  local_78.length.bodylen_ondisk = 0;
  local_78.length.flag = '\0';
  local_78.length.checksum = '\0';
  local_78.length.reserved = 0;
  local_78.timestamp = 0;
  local_78.key = (void *)0x0;
  local_78.field_3.seqnum = 0;
  local_78.meta = (void *)0x0;
  local_78.body = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (doc == (fdb_doc *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (doc->key == (void *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (0xffffffffffff007f < doc->keylen - 0xff81) {
    if (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0) &&
       ((ulong)((handle->config).blocksize - 0x100) < doc->keylen)) {
      return FDB_RESULT_INVALID_ARGS;
    }
    LOCK();
    bVar12 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar12) {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (!bVar12) {
      return FDB_RESULT_HANDLE_BUSY;
    }
    pfVar9 = doc;
    pfVar10 = (fdb_doc *)local_f8;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pfVar10->keylen = pfVar9->keylen;
      pfVar9 = (fdb_doc *)&pfVar9->metalen;
      pfVar10 = (fdb_doc *)&pfVar10->metalen;
    }
    if (handle->kvs != (kvs_info *)0x0) {
      uVar11 = (ulong)(handle->config).chunksize;
      local_f8 = (undefined1  [8])(doc->keylen + uVar11);
      lVar7 = -(doc->keylen + uVar11 + 0xf & 0xfffffffffffffff0);
      buf = local_f8 + lVar7;
      id = handle->kvs->id;
      doc_kv.size_ondisk = (size_t)buf;
      *(undefined8 *)((long)&uStack_100 + lVar7) = 0x12f13c;
      kvid2buf(uVar11,id,buf);
      __n = doc->keylen;
      pvVar2 = doc->key;
      *(undefined8 *)((long)&uStack_100 + lVar7) = 0x12f14e;
      memcpy(buf + uVar11,pvVar2,__n);
    }
    if (handle->shandle == (snap_handle *)0x0) {
      *(undefined8 *)(buf + -8) = 0x12f180;
      fdb_check_file_reopen(handle,(file_status_t *)0x0);
      txn = handle->fhandle->root->txn;
      if (txn == (fdb_txn *)0x0) {
        txn = &handle->file->global_txn;
      }
    }
    else {
      txn = handle->shandle->snap_txn;
    }
    doc_kv.deleted = (handle->kvs_config).create_if_missing;
    doc_kv._73_3_ = *(undefined3 *)&(handle->kvs_config).field_0x1;
    doc_kv.flags = *(uint32_t *)&(handle->kvs_config).field_0x4;
    handle_00 = handle->dhandle;
    fVar4 = FDB_RESULT_KEY_NOT_FOUND;
    if ((handle->config).do_not_search_wal == false) {
      file = handle->file;
      shandle = handle->shandle;
      pfVar9 = (fdb_doc *)local_f8;
      if (handle->kvs == (kvs_info *)0x0) {
        pfVar9 = doc;
      }
      *(undefined8 *)(buf + -8) = 0x12f1f8;
      fVar4 = wal_find(txn,file,(_fdb_key_cmp_info *)&doc_kv.deleted,shandle,pfVar9,&local_38);
    }
    if (handle->shandle == (snap_handle *)0x0) {
      *(undefined8 *)(buf + -8) = 0x12f20d;
      fdb_sync_db_header(handle);
    }
    LOCK();
    paVar1 = &handle->op_stats->num_gets;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (fVar4 == FDB_RESULT_KEY_NOT_FOUND) {
      *(undefined8 *)(buf + -8) = 0x12f224;
      _fdb_sync_dirty_root(handle);
      trie = handle->trie;
      pfVar9 = (fdb_doc *)local_f8;
      if (handle->kvs == (kvs_info *)0x0) {
        pfVar9 = doc;
      }
      pvVar2 = pfVar9->key;
      sVar3 = pfVar9->keylen;
      *(undefined8 *)(buf + -8) = 0x12f246;
      hVar5 = hbtrie_find(trie,pvVar2,(int)sVar3,&local_38);
      handle_01 = handle->bhandle;
      *(undefined8 *)(buf + -8) = 0x12f252;
      btreeblk_end(handle_01);
      local_38 = local_38 >> 0x38 | (local_38 & 0xff000000000000) >> 0x28 |
                 (local_38 & 0xff0000000000) >> 0x18 | (local_38 & 0xff00000000) >> 8 |
                 (local_38 & 0xff000000) << 8 | (local_38 & 0xff0000) << 0x18 |
                 (local_38 & 0xff00) << 0x28 | local_38 << 0x38;
      *(undefined8 *)(buf + -8) = 0x12f263;
      _fdb_release_dirty_root(handle);
      bVar12 = hVar5 == HBTRIE_RESULT_SUCCESS;
    }
    else {
      bVar12 = false;
    }
    uVar11 = local_38;
    if ((fVar4 == FDB_RESULT_SUCCESS && local_38 != 0xffffffffffffffff) || (bVar12)) {
      local_78.meta = doc->meta;
      local_78.body = doc->body;
      bVar12 = local_78.meta == (void *)0x0;
      body_alloc = local_78.body == (void *)0x0;
      if (handle->kvs == (kvs_info *)0x0) {
        uVar8 = (undefined2)doc->keylen;
        local_78.key = doc->key;
      }
      else {
        uVar8 = local_f8._0_2_;
        doc->deleted = (bool)doc_kv.body._0_1_;
        local_78.key = (void *)doc_kv.size_ondisk;
      }
      local_78.length.keylen = uVar8;
      if ((fVar4 != FDB_RESULT_SUCCESS) || (doc->deleted != true)) {
        *(undefined8 *)(buf + -8) = 0x12f30a;
        iVar6 = docio_read_doc(handle_00,uVar11,&local_78,true);
        if (0 < iVar6) {
          if ((local_f8 == (undefined1  [8])(local_78.length._0_8_ & 0xffff)) &&
             ((local_78.length._8_8_ & 0x400000000) == 0)) {
            doc->seqnum = (fdb_seqnum_t)local_78.field_3;
            doc->metalen = (ulong)local_78.length._0_8_ >> 0x10 & 0xffff;
            doc->bodylen = (ulong)local_78.length._0_8_ >> 0x20;
            doc->meta = local_78.meta;
            doc->body = local_78.body;
            doc->deleted = false;
            doc->size_ondisk =
                 (ulong)((local_78.length._0_4_ & 0xffff) + ((uint)local_78.length._0_4_ >> 0x10) +
                        local_78.length.bodylen_ondisk) + 0x20;
            doc->offset = local_38;
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            return FDB_RESULT_SUCCESS;
          }
          *(undefined8 *)(buf + -8) = 0x12f392;
          free_docio_object(&local_78,'\0',bVar12,body_alloc);
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          return FDB_RESULT_KEY_NOT_FOUND;
        }
        LOCK();
        if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        }
        UNLOCK();
        if (iVar6 != 0) {
          return (fdb_status)iVar6;
        }
        return FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_KEY_NOT_FOUND;
  }
  return FDB_RESULT_INVALID_ARGS;
}

Assistant:

LIBFDB_API
fdb_status fdb_get(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct filemgr *wal_file = NULL;
    struct docio_handle *dhandle;
    struct _fdb_key_cmp_info cmp_info;
    fdb_status wr;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || !doc->key || doc->keylen == 0 ||
        doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    doc_kv = *doc;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_kv.keylen = doc->keylen + size_chunk;
        doc_kv.key = alca(uint8_t, doc_kv.keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_kv.key);
        memcpy((uint8_t*)doc_kv.key + size_chunk, doc->key, doc->keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, &doc_kv,
                          &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc,
                          &offset);
        }
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        if (handle->kvs) {
            hr = hbtrie_find(handle->trie, doc_kv.key, doc_kv.keylen,
                             (void *)&offset);
        } else {
            hr = hbtrie_find(handle->trie, doc->key, doc->keylen,
                             (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         hr == HBTRIE_RESULT_SUCCESS) {
        bool alloced_meta = doc->meta ? false : true;
        bool alloced_body = doc->body ? false : true;
        if (handle->kvs) {
            _doc.key = doc_kv.key;
            _doc.length.keylen = doc_kv.keylen;
            doc->deleted = doc_kv.deleted; // update deleted field if wal_find
        } else {
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
        }
        _doc.meta = doc->meta;
        _doc.body = doc->body;

        if (wr == FDB_RESULT_SUCCESS && doc->deleted) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.keylen != doc_kv.keylen ||
            _doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 0, alloced_meta, alloced_body);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}